

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_pixelformat.cpp
# Opt level: O0

char * get_format_name(ALLEGRO_BITMAP *bmp)

{
  int iVar1;
  long in_RDI;
  uint i;
  int format;
  uint local_18;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = "none";
  }
  else {
    iVar1 = al_get_bitmap_format(in_RDI);
    for (local_18 = 0; local_18 < 0x1f; local_18 = local_18 + 1) {
      if (formats[local_18].format == iVar1) {
        return formats[local_18].name;
      }
    }
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

const char *get_format_name(ALLEGRO_BITMAP *bmp)
{
   if (!bmp)
      return "none";

   int format = al_get_bitmap_format(bmp);
   for (unsigned i = 0; i < NUM_FORMATS; i++) {
      if (formats[i].format == format)
         return formats[i].name;
   }
   return "unknown";
}